

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_METAL_end(Context *ctx)

{
  int iVar1;
  Context *ctx_local;
  
  iVar1 = shader_is_pixel(ctx);
  if (iVar1 != 0) {
    iVar1 = shader_version_atleast(ctx,'\x02','\0');
    if (iVar1 == 0) {
      set_used_register(ctx,REG_TYPE_COLOROUT,0,1);
      output_line(ctx,"oC0 = r0;");
    }
  }
  if (ctx->previous_opcode != 0x1c) {
    emit_METAL_RET(ctx);
  }
  return;
}

Assistant:

static void emit_METAL_end(Context *ctx)
{
    // !!! FIXME: maybe handle this at a higher level?
    // ps_1_* writes color to r0 instead oC0. We move it to the right place.
    // We don't have to worry about a RET opcode messing this up, since
        //  RET isn't available before ps_2_0.
    if (shader_is_pixel(ctx) && !shader_version_atleast(ctx, 2, 0))
    {
        set_used_register(ctx, REG_TYPE_COLOROUT, 0, 1);
        output_line(ctx, "oC0 = r0;");
    } // if

    // !!! FIXME: maybe handle this at a higher level?
    // force a RET opcode if we're at the end of the stream without one.
    if (ctx->previous_opcode != OPCODE_RET)
        emit_METAL_RET(ctx);
}